

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  cmUnexpectedCommand *this_00;
  string local_40;
  char *local_20;
  char *error_local;
  string *name_local;
  cmState *this_local;
  
  local_20 = error;
  error_local = (char *)name;
  name_local = (string *)this;
  this_00 = (cmUnexpectedCommand *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_40,(string *)error_local);
  cmUnexpectedCommand::cmUnexpectedCommand(this_00,&local_40,local_20);
  AddBuiltinCommand(this,name,(cmCommand *)this_00);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(name, new cmUnexpectedCommand(name, error));
}